

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O2

bool OutputBin(FILE *file,char *buf,uint startIndex,uint stopIndex)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  char hexNumber [3];
  uint convertedByte;
  FILE *local_140;
  char outBuf [256];
  
  hexNumber[2] = '\0';
  uVar4 = 0;
  uVar3 = startIndex;
  local_140 = (FILE *)file;
  while( true ) {
    if (stopIndex <= uVar3) {
      sVar2 = fwrite(outBuf,1,uVar4 & 0xffffffff,local_140);
      return sVar2 == (uVar4 & 0xffffffff);
    }
    hexNumber[0] = buf[uVar4 * 2 + (long)(int)startIndex];
    hexNumber[1] = buf[uVar4 * 2 + (long)(int)startIndex + 1];
    convertedByte = 0;
    iVar1 = __isoc99_sscanf(hexNumber,"%x",&convertedByte);
    if (iVar1 != 1) break;
    outBuf[uVar4 & 0xffffffff] = (char)convertedByte;
    uVar4 = uVar4 + 1;
    uVar3 = uVar3 + 2;
  }
  return false;
}

Assistant:

static bool OutputBin(FILE* file, const char * buf,
                      unsigned int startIndex, unsigned int stopIndex)
{
  bool success = true;
  char hexNumber[3];
  hexNumber[2] = '\0';
  char outBuf[256];
  unsigned int outBufCount = 0;
  for (unsigned int i = startIndex; i < stopIndex; i += 2)
    {
    hexNumber[0] = buf[i];
    hexNumber[1] = buf[i+1];
    unsigned int convertedByte = 0;
    if (sscanf(hexNumber, "%x", &convertedByte) != 1)
      {
      success = false;
      break;
      }
    outBuf[outBufCount] = static_cast<char>(convertedByte & 0xff);
    outBufCount++;
    }
  if (success)
    {
    success = (fwrite(outBuf, 1, outBufCount, file)==outBufCount);
    }
  return success;
}